

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::doFastFormatInt32
          (DecimalFormat *this,int32_t input,bool isNegative,UnicodeString *output)

{
  char16_t cVar1;
  DecimalFormatFields *pDVar2;
  div_t dVar3;
  undefined7 in_register_00000011;
  char cVar4;
  char cVar5;
  char16_t *pcVar6;
  char cVar7;
  ConstChar16Ptr local_78;
  UnicodeString *local_70;
  char16_t localBuffer [13];
  char16_t local_3e [7];
  
  dVar3.rem = 0;
  dVar3.quot = input;
  local_70 = output;
  if ((int)CONCAT71(in_register_00000011,isNegative) != 0) {
    UnicodeString::append(output,(this->fields->fastData).cpMinusSign);
    dVar3.quot = -input;
    dVar3.rem = 0;
  }
  pcVar6 = local_3e;
  pDVar2 = this->fields;
  cVar7 = (pDVar2->fastData).maxInt;
  cVar4 = '\0';
  if (cVar7 < '\x01') {
    cVar7 = '\0';
  }
  cVar5 = '\0';
  for (; (cVar7 != cVar4 && ((dVar3.quot != 0 || (cVar4 < (pDVar2->fastData).minInt))));
      cVar4 = cVar4 + '\x01') {
    if (cVar5 == '\x03') {
      cVar1 = (pDVar2->fastData).cpGroupingSeparator;
      if (cVar1 == L'\0') {
        cVar5 = '\x04';
      }
      else {
        pcVar6[-1] = cVar1;
        pcVar6 = pcVar6 + -1;
        cVar5 = '\x01';
      }
    }
    else {
      cVar5 = cVar5 + '\x01';
    }
    dVar3 = div(dVar3.quot,10);
    pcVar6[-1] = (short)dVar3.rem + (pDVar2->fastData).cpZero;
    pcVar6 = pcVar6 + -1;
  }
  local_78.p_ = pcVar6;
  UnicodeString::append
            (local_70,&local_78,0xd - (int)((ulong)((long)pcVar6 - (long)localBuffer) >> 1));
  return;
}

Assistant:

void DecimalFormat::doFastFormatInt32(int32_t input, bool isNegative, UnicodeString& output) const {
    U_ASSERT(fields->canUseFastFormat);
    if (isNegative) {
        output.append(fields->fastData.cpMinusSign);
        U_ASSERT(input != INT32_MIN);  // handled by callers
        input = -input;
    }
    // Cap at int32_t to make the buffer small and operations fast.
    // Longest string: "2,147,483,648" (13 chars in length)
    static constexpr int32_t localCapacity = 13;
    char16_t localBuffer[localCapacity];
    char16_t* ptr = localBuffer + localCapacity;
    int8_t group = 0;
    for (int8_t i = 0; i < fields->fastData.maxInt && (input != 0 || i < fields->fastData.minInt); i++) {
        if (group++ == 3 && fields->fastData.cpGroupingSeparator != 0) {
            *(--ptr) = fields->fastData.cpGroupingSeparator;
            group = 1;
        }
        std::div_t res = std::div(input, 10);
        *(--ptr) = static_cast<char16_t>(fields->fastData.cpZero + res.rem);
        input = res.quot;
    }
    int32_t len = localCapacity - static_cast<int32_t>(ptr - localBuffer);
    output.append(ptr, len);
}